

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

void Gia_ManEdgeFromArray(Gia_Man_t *p,Vec_Int_t *vArray)

{
  int iVar1;
  int iNext;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint local_28;
  int Count;
  int iObj2;
  int iObj1;
  int i;
  Vec_Int_t *vArray_local;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  iVar1 = Gia_ManObjNum(p);
  pVVar3 = Vec_IntStart(iVar1);
  p->vEdge1 = pVVar3;
  iVar1 = Gia_ManObjNum(p);
  pVVar3 = Vec_IntStart(iVar1);
  p->vEdge2 = pVVar3;
  iObj2 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vArray);
    if (iVar1 <= iObj2 + 1) {
      if (local_28 != 0) {
        printf("Found %d violations during edge conversion.\n",(ulong)local_28);
      }
      return;
    }
    iVar1 = Vec_IntEntry(vArray,iObj2);
    iNext = Vec_IntEntry(vArray,iObj2 + 1);
    if (iNext <= iVar1) break;
    iVar2 = Gia_ObjEdgeAdd(iVar1,iNext,p->vEdge1,p->vEdge2);
    iVar1 = Gia_ObjEdgeAdd(iNext,iVar1,p->vEdge1,p->vEdge2);
    local_28 = iVar1 + iVar2 + local_28;
    iObj2 = iObj2 + 2;
  }
  __assert_fail("iObj1 < iObj2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x51,"void Gia_ManEdgeFromArray(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManEdgeFromArray( Gia_Man_t * p, Vec_Int_t * vArray )
{
    int i, iObj1, iObj2, Count = 0;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vArray, iObj1, iObj2, i )
    {
        assert( iObj1 < iObj2 );
        Count += Gia_ObjEdgeAdd( iObj1, iObj2, p->vEdge1, p->vEdge2 );
        Count += Gia_ObjEdgeAdd( iObj2, iObj1, p->vEdge1, p->vEdge2 );
    }
    if ( Count ) 
        printf( "Found %d violations during edge conversion.\n", Count );
}